

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QGraphicsAnchorLayoutPrivate::removeAnchor
          (QGraphicsAnchorLayoutPrivate *this,AnchorVertex *firstVertex,AnchorVertex *secondVertex)

{
  QGraphicsLayoutItem *pQVar1;
  QGraphicsLayoutItem *pQVar2;
  QGraphicsLayoutItem *pQVar3;
  long lVar4;
  long lVar5;
  AnchorPoint AVar6;
  long lVar7;
  AnchorPoint AVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar11;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  pQVar2 = firstVertex->m_item;
  pQVar3 = secondVertex->m_item;
  removeAnchor_helper(this,firstVertex,secondVertex);
  bVar9 = true;
  if (pQVar2 != pQVar1) {
    AVar8 = ~AnchorLeft;
    do {
      AVar6 = AVar8 + AnchorHorizontalCenter;
      local_48.first = pQVar2;
      local_48.second = AVar6;
      pVar11 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
               ::value(&this->m_vertexList,&local_48);
      if ((pVar11.first != (AnchorVertex *)0x0) &&
         ((int)((AVar8 == AnchorLeft || AVar8 == AnchorTop) + 1) < pVar11.second)) {
        bVar9 = true;
        break;
      }
      bVar9 = AVar6 < AnchorBottom;
      AVar8 = AVar6;
    } while (AVar6 != AnchorBottom);
  }
  bVar10 = true;
  if (pQVar3 != pQVar1) {
    AVar8 = ~AnchorLeft;
    do {
      AVar6 = AVar8 + AnchorHorizontalCenter;
      local_48.first = pQVar3;
      local_48.second = AVar6;
      pVar11 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
               ::value(&this->m_vertexList,&local_48);
      if ((pVar11.first != (AnchorVertex *)0x0) &&
         ((int)((AVar8 == AnchorLeft || AVar8 == AnchorTop) + 1) < pVar11.second)) {
        bVar10 = true;
        break;
      }
      bVar10 = AVar6 < AnchorBottom;
      AVar8 = AVar6;
    } while (AVar6 != AnchorBottom);
  }
  if (!bVar9) {
    lVar4 = (this->items).d.size;
    if (lVar4 != 0) {
      lVar7 = -8;
      do {
        if (lVar4 * -8 + lVar7 == -8) break;
        lVar5 = lVar7 + 8;
        lVar7 = lVar7 + 8;
      } while (*(QGraphicsLayoutItem **)((long)(this->items).d.ptr + lVar5) != pQVar2);
    }
    (*pQVar1->_vptr_QGraphicsLayoutItem[0xb])(pQVar1);
  }
  if (!bVar10) {
    lVar4 = (this->items).d.size;
    if (lVar4 != 0) {
      lVar7 = -8;
      do {
        if (lVar4 * -8 + lVar7 == -8) break;
        lVar5 = lVar7 + 8;
        lVar7 = lVar7 + 8;
      } while (*(QGraphicsLayoutItem **)((long)(this->items).d.ptr + lVar5) != pQVar3);
    }
    (*pQVar1->_vptr_QGraphicsLayoutItem[0xb])(pQVar1);
  }
  (*pQVar1->_vptr_QGraphicsLayoutItem[7])(pQVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeAnchor(AnchorVertex *firstVertex,
                                                AnchorVertex *secondVertex)
{
    Q_Q(QGraphicsAnchorLayout);

    // Save references to items while it's safe to assume the vertices exist
    QGraphicsLayoutItem *firstItem = firstVertex->m_item;
    QGraphicsLayoutItem *secondItem = secondVertex->m_item;

    // Delete the anchor (may trigger deletion of center vertices)
    removeAnchor_helper(firstVertex, secondVertex);

    // Ensure no dangling pointer is left behind
    firstVertex = secondVertex = nullptr;

    // Checking if the item stays in the layout or not
    bool keepFirstItem = false;
    bool keepSecondItem = false;

    std::pair<AnchorVertex *, int> v;
    int refcount = -1;

    if (firstItem != q) {
        for (int i = Qt::AnchorLeft; i <= Qt::AnchorBottom; ++i) {
            v = m_vertexList.value(std::pair(firstItem, static_cast<Qt::AnchorPoint>(i)));
            if (v.first) {
                if (i == Qt::AnchorHorizontalCenter || i == Qt::AnchorVerticalCenter)
                    refcount = 2;
                else
                    refcount = 1;

                if (v.second > refcount) {
                    keepFirstItem = true;
                    break;
                }
            }
        }
    } else
        keepFirstItem = true;

    if (secondItem != q) {
        for (int i = Qt::AnchorLeft; i <= Qt::AnchorBottom; ++i) {
            v = m_vertexList.value(std::pair(secondItem, static_cast<Qt::AnchorPoint>(i)));
            if (v.first) {
                if (i == Qt::AnchorHorizontalCenter || i == Qt::AnchorVerticalCenter)
                    refcount = 2;
                else
                    refcount = 1;

                if (v.second > refcount) {
                    keepSecondItem = true;
                    break;
                }
            }
        }
    } else
        keepSecondItem = true;

    if (!keepFirstItem)
        q->removeAt(items.indexOf(firstItem));

    if (!keepSecondItem)
        q->removeAt(items.indexOf(secondItem));

    // Removing anchors invalidates the layout
    q->invalidate();
}